

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_vfs_tell(ma_vfs *pVFS,ma_vfs_file file,ma_int64 *pCursor)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (pCursor != (ma_int64 *)0x0) {
    *pCursor = 0;
    if (file != (ma_vfs_file)0x0 && pVFS != (ma_vfs *)0x0) {
      if (*(code **)((long)pVFS + 0x30) != (code *)0x0) {
        mVar1 = (**(code **)((long)pVFS + 0x30))();
        return mVar1;
      }
      mVar1 = MA_NOT_IMPLEMENTED;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_tell(ma_vfs* pVFS, ma_vfs_file file, ma_int64* pCursor)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (pVFS == NULL || file == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onTell == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onTell(pVFS, file, pCursor);
}